

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clust2snp.cpp
# Opt level: O2

void to_file(vector<variant_t,_std::allocator<variant_t>_> *output_variants,string *out_path)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  pair<int,_int> pVar5;
  int iVar6;
  ulong uVar7;
  pointer pvVar8;
  string snv_type;
  unsigned_long local_320;
  undefined8 local_310;
  ulong local_308;
  string DNA;
  string local_2d8;
  string ID;
  variant_t v;
  ofstream out_file;
  
  std::ofstream::ofstream(&out_file,(string *)out_path,_S_out);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "(4/4) Computing edit distances and saving SNPs/indels to file ... ");
  std::endl<char,std::char_traits<char>>(poVar4);
  pvVar8 = (output_variants->super__Vector_base<variant_t,_std::allocator<variant_t>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pvVar1 = (output_variants->super__Vector_base<variant_t,_std::allocator<variant_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_320 = 1;
  local_310 = 0;
  local_308 = 100;
  for (; pvVar8 != pvVar1; pvVar8 = pvVar8 + 1) {
    variant_t::variant_t(&v,pvVar8);
    pVar5 = distance(&v.left_context_0,&v.left_context_1);
    if (pVar5.first <= max_snvs_def) {
      uVar7 = (ulong)pVar5 >> 0x20;
      ID._M_dataplus._M_p = (pointer)&ID.field_2;
      ID._M_string_length = 0;
      ID.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::assign((char *)&ID);
      std::__cxx11::to_string(&snv_type,local_320);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::~string((string *)&snv_type);
      std::__cxx11::string::append((char *)&ID);
      std::__cxx11::to_string(&snv_type,v.right_context._M_string_length);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::~string((string *)&snv_type);
      std::__cxx11::string::append((char *)&ID);
      snv_type._M_string_length = 0;
      snv_type._M_dataplus._M_p = (pointer)&snv_type.field_2;
      snv_type.field_2._M_local_buf[0] = '\0';
      iVar6 = pVar5.second;
      if (uVar7 == 0) {
        std::__cxx11::string::push_back((char)&snv_type);
        std::__cxx11::string::append((char *)&snv_type);
        std::__cxx11::string::push_back((char)&snv_type);
      }
      else if (iVar6 == 0 || (long)pVar5 < 0) {
        std::__cxx11::string::append((char *)&snv_type);
        std::__cxx11::string::substr((ulong)&DNA,(ulong)&v.left_context_1);
        std::__cxx11::string::append((string *)&snv_type);
        std::__cxx11::string::~string((string *)&DNA);
      }
      else {
        std::__cxx11::string::substr((ulong)&DNA,(ulong)&v);
        std::__cxx11::string::append((string *)&snv_type);
        std::__cxx11::string::~string((string *)&DNA);
        std::__cxx11::string::append((char *)&snv_type);
      }
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::append((char *)&ID);
      std::__cxx11::to_string(&DNA,v.support_0);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::~string((string *)&DNA);
      std::__cxx11::string::append((char *)&ID);
      poVar4 = std::operator<<((ostream *)&out_file,(string *)&ID);
      std::endl<char,std::char_traits<char>>(poVar4);
      DNA._M_dataplus._M_p = (pointer)&DNA.field_2;
      DNA._M_string_length = 0;
      DNA.field_2._M_local_buf[0] = '\0';
      if ((iVar6 == 0 || (long)pVar5 < 0) && uVar7 != 0) {
        std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&v);
        std::__cxx11::string::operator=((string *)&DNA,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&DNA);
      }
      std::__cxx11::string::append((string *)&DNA);
      poVar4 = std::operator<<((ostream *)&out_file,(string *)&DNA);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::assign((char *)&ID);
      std::__cxx11::to_string(&local_2d8,local_320);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::append((char *)&ID);
      std::__cxx11::to_string(&local_2d8,v.right_context._M_string_length);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::append((char *)&ID);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::append((char *)&ID);
      std::__cxx11::to_string(&local_2d8,v.support_1);
      std::__cxx11::string::append((string *)&ID);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::append((char *)&ID);
      poVar4 = std::operator<<((ostream *)&out_file,(string *)&ID);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::__cxx11::string::assign((char *)&DNA);
      if ((iVar6 == 0 || (long)pVar5 < 0) || uVar7 == 0) {
        std::__cxx11::string::_M_assign((string *)&DNA);
      }
      else {
        std::__cxx11::string::substr((ulong)&local_2d8,(ulong)&v.left_context_1);
        std::__cxx11::string::operator=((string *)&DNA,(string *)&local_2d8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      std::__cxx11::string::append((string *)&DNA);
      poVar4 = std::operator<<((ostream *)&out_file,(string *)&DNA);
      std::endl<char,std::char_traits<char>>(poVar4);
      local_320 = local_320 + 1;
      std::__cxx11::string::~string((string *)&DNA);
      std::__cxx11::string::~string((string *)&snv_type);
      std::__cxx11::string::~string((string *)&ID);
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = ((long)(output_variants->
                          super__Vector_base<variant_t,_std::allocator<variant_t>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(output_variants->super__Vector_base<variant_t,_std::allocator<variant_t>_>
                         )._M_impl.super__Vector_impl_data._M_start) / 0x68;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_308;
    iVar6 = SUB164(auVar3 / auVar2,0);
    if ((int)local_310 + 10 <= iVar6) {
      poVar4 = std::operator<<((ostream *)&std::cout," ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar6);
      poVar4 = std::operator<<(poVar4,"% done.");
      std::endl<char,std::char_traits<char>>(poVar4);
      local_310 = SUB168(auVar3 / auVar2,0);
    }
    variant_t::~variant_t(&v);
    local_308 = local_308 + 100;
  }
  std::ofstream::~ofstream(&out_file);
  return;
}

Assistant:

void to_file(vector<variant_t> & output_variants, string & out_path){

	ofstream out_file = ofstream(out_path);

	uint64_t id_nr = 1;
	uint64_t idx = 0;

	int perc = 0;
	int last_perc = 0;

	cout << "(4/4) Computing edit distances and saving SNPs/indels to file ... " << endl;
	for(auto v:output_variants){

		auto d = distance(v.left_context_0,v.left_context_1);

		if(d.first <= max_snvs_def){

			/*
			 * sample 1
			 */

			string ID;

			if(d.second != 0){

				ID =  ">INDEL_higher_path_";

			}else{

				ID =  ">SNP_higher_path_";

			}

			ID.append(to_string(id_nr));
			ID.append("|P_1:");
			ID.append(to_string(v.right_context.size()));
			ID.append("_");

			string snv_type;

			if(d.second==0){

				snv_type += v.left_context_0[v.left_context_0.size()-1];
				snv_type.append("/");
				snv_type += v.left_context_1[v.left_context_1.size()-1];

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				snv_type.append(v.left_context_0.substr(v.left_context_0.size()-d.second));
				snv_type.append("/");

			}else{//insert of length -d.second in v.left_context_1

				snv_type.append("/");
				snv_type.append(v.left_context_1.substr(v.left_context_1.size() - (-d.second)));

			}

			ID.append(snv_type);
			ID.append("|");
			ID.append(std::to_string(v.support_0));//we write the number of reads supporting this variant
			//ID.append("high");
			ID.append("|nb_pol_1");

			out_file << ID << endl;

			string DNA;

			if(d.second==0){

				DNA = v.left_context_0;

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				DNA = v.left_context_0;

			}else{//insert of length -d.second in v.left_context_1

				DNA = v.left_context_0.substr(-d.second);

			}

			DNA.append(v.right_context);

			out_file << DNA << endl;

			/*
			 * sample 2
			 */

			if(d.second != 0){

				ID =  ">INDEL_lower_path_";

			}else{

				ID =  ">SNP_lower_path_";

			}

			ID.append(to_string(id_nr));
			ID.append("|P_1:");
			ID.append(to_string(v.right_context.size()));
			ID.append("_");
			ID.append(snv_type);
			ID.append("|");
			ID.append(std::to_string(v.support_1));
			//ID.append("high");
			ID.append("|nb_pol_1");

			out_file << ID << endl;

			DNA = "";

			if(d.second==0){

				DNA = v.left_context_1;

			}else if(d.second>0){//insert of length d.second in v.left_context_0

				DNA = v.left_context_1.substr(d.second);

			}else{//insert of length -d.second in v.left_context_1

				DNA = v.left_context_1;

			}

			DNA.append(v.right_context);
			out_file << DNA << endl;

			id_nr++;

		}

		idx++;

		perc = (idx*100)/output_variants.size();
		if(perc >= last_perc+10){

			last_perc=perc;
			cout << " " << perc << "% done." << endl;

		}

	}

}